

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O1

Fad<long_double> * __thiscall
TPZMatrix<Fad<long_double>_>::operator()(TPZMatrix<Fad<long_double>_> *this,int64_t row,int64_t col)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (((row < (this->super_TPZBaseMatrix).fRow) && (-1 < (col | row))) &&
     (col < (this->super_TPZBaseMatrix).fCol)) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])(this,row,col);
    return (Fad<long_double> *)CONCAT44(extraout_var,iVar1);
  }
  Error("TPZMatrix<TVar>::Operator()","Index out of range");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h",
             0x33d);
}

Assistant:

inline TVar &TPZMatrix<TVar>::operator()(const int64_t row, const int64_t col) {
	// bound checking
#ifndef PZNODEBUG
	if ( (row >= Rows()) || (col >= Cols()) || row <0 || col<0 ) {
		Error("TPZMatrix<TVar>::Operator()","Index out of range");
        DebugStop();
	}
#endif
	return s(row,col);
}